

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O3

void __thiscall
cbtQuantizedBvh::walkStacklessTree
          (cbtQuantizedBvh *this,cbtNodeOverlapCallback *nodeCallback,cbtVector3 *aabbMin,
          cbtVector3 *aabbMax)

{
  byte bVar1;
  int iVar2;
  cbtOptimizedBvhNode *pcVar3;
  int iVar4;
  bool bVar5;
  
  if (this->m_curNodeIndex < 1) {
    iVar2 = 0;
  }
  else {
    pcVar3 = (this->m_contiguousNodes).m_data;
    iVar4 = 0;
    iVar2 = 0;
    do {
      if (((pcVar3->m_aabbMaxOrg).m_floats[0] < aabbMin->m_floats[0]) ||
         (aabbMax->m_floats[0] < (pcVar3->m_aabbMinOrg).m_floats[0])) {
        bVar1 = 0;
      }
      else {
        bVar1 = 1;
      }
      if (((pcVar3->m_aabbMaxOrg).m_floats[2] < aabbMin->m_floats[2]) ||
         (aabbMax->m_floats[2] < (pcVar3->m_aabbMinOrg).m_floats[2])) {
        bVar1 = 0;
      }
      if (((pcVar3->m_aabbMaxOrg).m_floats[1] < aabbMin->m_floats[1]) ||
         (aabbMax->m_floats[1] < (pcVar3->m_aabbMinOrg).m_floats[1])) {
        bVar5 = pcVar3->m_escapeIndex == -1;
        bVar1 = 0;
LAB_008a72a0:
        if ((bool)(bVar5 | bVar1)) goto LAB_008a72da;
        iVar4 = iVar4 + pcVar3->m_escapeIndex;
        pcVar3 = pcVar3 + pcVar3->m_escapeIndex;
      }
      else {
        bVar5 = pcVar3->m_escapeIndex == -1;
        if (!(bool)(bVar1 & bVar5)) goto LAB_008a72a0;
        (*nodeCallback->_vptr_cbtNodeOverlapCallback[2])
                  (nodeCallback,(ulong)(uint)pcVar3->m_subPart,(ulong)(uint)pcVar3->m_triangleIndex)
        ;
LAB_008a72da:
        pcVar3 = pcVar3 + 1;
        iVar4 = iVar4 + 1;
      }
      iVar2 = iVar2 + 1;
    } while (iVar4 < this->m_curNodeIndex);
  }
  if (maxIterations < iVar2) {
    maxIterations = iVar2;
  }
  return;
}

Assistant:

void cbtQuantizedBvh::walkStacklessTree(cbtNodeOverlapCallback* nodeCallback, const cbtVector3& aabbMin, const cbtVector3& aabbMax) const
{
	cbtAssert(!m_useQuantization);

	const cbtOptimizedBvhNode* rootNode = &m_contiguousNodes[0];
	int escapeIndex, curIndex = 0;
	int walkIterations = 0;
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned aabbOverlap;

	while (curIndex < m_curNodeIndex)
	{
		//catch bugs in tree data
		cbtAssert(walkIterations < m_curNodeIndex);

		walkIterations++;
		aabbOverlap = TestAabbAgainstAabb2(aabbMin, aabbMax, rootNode->m_aabbMinOrg, rootNode->m_aabbMaxOrg);
		isLeafNode = rootNode->m_escapeIndex == -1;

		//PCK: unsigned instead of bool
		if (isLeafNode && (aabbOverlap != 0))
		{
			nodeCallback->processNode(rootNode->m_subPart, rootNode->m_triangleIndex);
		}

		//PCK: unsigned instead of bool
		if ((aabbOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		}
		else
		{
			escapeIndex = rootNode->m_escapeIndex;
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;
}